

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.h
# Opt level: O0

bool __thiscall mjs::native_object::do_native_put(native_object *this,string *name,value *val)

{
  bool bVar1;
  wstring_view local_40;
  native_object_property *local_30;
  native_object_property *it;
  value *val_local;
  string *name_local;
  native_object *this_local;
  
  it = (native_object_property *)val;
  val_local = (value *)name;
  name_local = (string *)this;
  local_40 = string::view(name);
  local_30 = find(this,&local_40);
  if (local_30 == (native_object_property *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = has_attributes(local_30->attributes,read_only);
    if (!bVar1) {
      (*local_30->put)(this,(value *)it);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool do_native_put(const string& name, const value& val) {
        if (auto it = find(name.view())) {
            if (!has_attributes(it->attributes, property_attribute::read_only)) {
                it->put(*this, val);
            }
            return true;
        } else {
            return false;
        }
    }